

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RollupOutput::PrintTreeToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  string_view str;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  byte bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  RollupRow *in_RDX;
  RollupOutput *in_RSI;
  byte in_R8B;
  byte in_R9B;
  RollupRow *child_row;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range2;
  bool in_stack_000000d6;
  bool in_stack_000000d7;
  ostream *in_stack_000000d8;
  undefined6 in_stack_000000e0;
  value_type *in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  value_type *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_78;
  double *local_70;
  undefined1 local_58 [16];
  string local_48 [30];
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined6 in_stack_ffffffffffffffd8;
  
  bVar4 = in_R8B & 1;
  bVar1 = in_R9B & 1;
  if (bVar4 == 0) {
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)in_RSI);
    str._M_str = in_stack_ffffffffffffff78;
    str._M_len = (size_t)in_stack_ffffffffffffff70;
    CSVEscape_abi_cxx11_(str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_48);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  sVar3 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size
                    ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                     &(in_RSI->toplevel_row_).filepercent);
  if (sVar3 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    PrintRowToCSV((RollupOutput *)parent_labels,(RollupRow *)out,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(tabs,CONCAT16(csvDiff,in_stack_000000e0)),in_stack_000000d8,
                  in_stack_000000d7,in_stack_000000d6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff10);
  }
  else {
    local_70 = &(in_RSI->toplevel_row_).filepercent;
    local_78._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                    in_stack_fffffffffffffef8);
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
              ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
               in_stack_fffffffffffffef8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator*(&local_78);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff60;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      PrintTreeToCSV(in_RSI,in_RDX,in_RCX,
                     (ostream *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffd8)),
                     (bool)in_stack_ffffffffffffffd7,(bool)in_stack_ffffffffffffffd6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      __gnu_cxx::
      __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_78);
    }
  }
  return;
}

Assistant:

void RollupOutput::PrintTreeToCSV(const RollupRow& row,
                                  std::vector<std::string> parent_labels,
                                  std::ostream* out, bool tabs, bool csvDiff) const {
  if (tabs) {
    parent_labels.push_back(row.name);
  } else {
    parent_labels.push_back(CSVEscape(row.name));
  }

  if (row.sorted_children.size() > 0) {
    for (const auto& child_row : row.sorted_children) {
      PrintTreeToCSV(child_row, parent_labels, out, tabs, csvDiff);
    }
  } else {
    PrintRowToCSV(row, parent_labels, out, tabs, csvDiff);
  }
}